

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  FILE *__stream;
  int *piVar3;
  char *pcVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  timeval tVar8;
  timeval older;
  int ec_14;
  int usTimeout;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  undefined1 auStack_268 [4];
  uint __i;
  timeval tv;
  undefined1 local_250 [4];
  curl_socket_t maxFd;
  fd_set writeSet;
  fd_set readSet;
  CURLMcode ec_13;
  CURLMcode ec_12;
  CURLMcode ec_11;
  CURLMcode ec_10;
  CURLMcode ec_9;
  CURLcode ec_8;
  CURLcode ec_7;
  CURLcode ec_6;
  CURLcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_110;
  int local_104;
  undefined1 auStack_100 [4];
  int success;
  timeval timeout;
  ReadWriteSockets sockets;
  CURLM *m;
  stat file_info;
  int error;
  int hd;
  FILE *hd_src;
  CURL *curl;
  int res;
  char *URL_local;
  
  curl._4_4_ = 0;
  sockets.write.count = 0;
  sockets.write.max_count = 0;
  memset(&timeout.tv_usec,0,0x20);
  _auStack_100 = -1;
  timeout.tv_sec = 0;
  local_104 = 0;
  tVar8 = tutil_tvnow();
  _ec_1 = tVar8.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_110 = tVar8.tv_usec;
  tv_test_start.tv_usec = local_110;
  if (libtest_arg3 == (char *)0x0) {
    curl_mfprintf(_stderr,"Usage: lib582 [url] [filename] [username]\n");
    URL_local._4_4_ = 0x76;
  }
  else {
    __stream = fopen64(libtest_arg2,"rb");
    if (__stream == (FILE *)0x0) {
      piVar3 = __errno_location();
      uVar1 = _stderr;
      iVar2 = *piVar3;
      file_info.__glibc_reserved[2]._0_4_ = iVar2;
      pcVar4 = strerror(iVar2);
      curl_mfprintf(uVar1,"fopen() failed with error: %d (%s)\n",iVar2,pcVar4);
      curl_mfprintf(_stderr,"Error opening file: (%s)\n",libtest_arg2);
      URL_local._4_4_ = 0x75;
    }
    else {
      iVar2 = fileno(__stream);
      file_info.__glibc_reserved[2]._4_4_ = fstat64(iVar2,(stat64 *)&m);
      if (file_info.__glibc_reserved[2]._4_4_ == -1) {
        piVar3 = __errno_location();
        uVar1 = _stderr;
        iVar2 = *piVar3;
        file_info.__glibc_reserved[2]._0_4_ = iVar2;
        pcVar4 = strerror(iVar2);
        curl_mfprintf(uVar1,"fstat() failed with error: %d (%s)\n",iVar2,pcVar4);
        curl_mfprintf(_stderr,"ERROR: cannot open file (%s)\n",libtest_arg2);
        fclose(__stream);
        URL_local._4_4_ = 0x74;
      }
      else {
        curl_mfprintf(_stderr,"Set to upload %d bytes\n",file_info.st_rdev & 0xffffffff);
        iVar2 = curl_global_init(3);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar5 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib582.c"
                        ,0x10b,iVar2,uVar5);
          curl._4_4_ = iVar2;
        }
        if (curl._4_4_ == 0) {
          lVar6 = curl_easy_init();
          if (lVar6 == 0) {
            curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib582.c"
                          ,0x111);
            curl._4_4_ = 0x7c;
          }
          if (curl._4_4_ == 0) {
            iVar2 = curl_easy_setopt(lVar6,0x2e,1);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar5 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib582.c"
                            ,0x114,iVar2,uVar5);
              curl._4_4_ = iVar2;
            }
            if (curl._4_4_ == 0) {
              iVar2 = curl_easy_setopt(lVar6,0x2712,URL);
              uVar1 = _stderr;
              if (iVar2 != 0) {
                uVar5 = curl_easy_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib582.c"
                              ,0x117,iVar2,uVar5);
                curl._4_4_ = iVar2;
              }
              if (curl._4_4_ == 0) {
                iVar2 = curl_easy_setopt(lVar6,0x29,1);
                uVar1 = _stderr;
                if (iVar2 != 0) {
                  uVar5 = curl_easy_strerror(iVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib582.c"
                                ,0x11a,iVar2,uVar5);
                  curl._4_4_ = iVar2;
                }
                if (curl._4_4_ == 0) {
                  iVar2 = curl_easy_setopt(lVar6,0x2719,__stream);
                  uVar1 = _stderr;
                  if (iVar2 != 0) {
                    uVar5 = curl_easy_strerror(iVar2);
                    curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib582.c"
                                  ,0x11d,iVar2,uVar5);
                    curl._4_4_ = iVar2;
                  }
                  if (curl._4_4_ == 0) {
                    iVar2 = curl_easy_setopt(lVar6,0x2715,libtest_arg3);
                    uVar1 = _stderr;
                    if (iVar2 != 0) {
                      uVar5 = curl_easy_strerror(iVar2);
                      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib582.c"
                                    ,0x11f,iVar2,uVar5);
                      curl._4_4_ = iVar2;
                    }
                    if (curl._4_4_ == 0) {
                      iVar2 = curl_easy_setopt(lVar6,0x27a8,"curl_client_key.pub");
                      uVar1 = _stderr;
                      if (iVar2 != 0) {
                        uVar5 = curl_easy_strerror(iVar2);
                        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib582.c"
                                      ,0x120,iVar2,uVar5);
                        curl._4_4_ = iVar2;
                      }
                      if (curl._4_4_ == 0) {
                        iVar2 = curl_easy_setopt(lVar6,0x27a9,"curl_client_key");
                        uVar1 = _stderr;
                        if (iVar2 != 0) {
                          uVar5 = curl_easy_strerror(iVar2);
                          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib582.c"
                                        ,0x121,iVar2,uVar5);
                          curl._4_4_ = iVar2;
                        }
                        if (curl._4_4_ == 0) {
                          iVar2 = curl_easy_setopt(lVar6,0x75a3,file_info.st_rdev);
                          uVar1 = _stderr;
                          if (iVar2 != 0) {
                            uVar5 = curl_easy_strerror(iVar2);
                            curl_mfprintf(uVar1,
                                          "%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib582.c"
                                          ,0x123,iVar2,uVar5);
                            curl._4_4_ = iVar2;
                          }
                          if (curl._4_4_ == 0) {
                            sockets.write._8_8_ = curl_multi_init();
                            if (sockets.write._8_8_ == 0) {
                              curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib582.c"
                                            ,0x125);
                              curl._4_4_ = 0x7b;
                            }
                            if (curl._4_4_ == 0) {
                              iVar2 = curl_multi_setopt(sockets.write._8_8_,0x4e21,
                                                        curlSocketCallback);
                              uVar1 = _stderr;
                              if (iVar2 != 0) {
                                uVar5 = curl_multi_strerror(iVar2);
                                curl_mfprintf(uVar1,
                                              "%s:%d curl_multi_setopt() failed, with code %d (%s)\n"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib582.c"
                                              ,0x127,iVar2,uVar5);
                                curl._4_4_ = iVar2;
                              }
                              if (curl._4_4_ == 0) {
                                iVar2 = curl_multi_setopt(sockets.write._8_8_,0x2712,
                                                          &timeout.tv_usec);
                                uVar1 = _stderr;
                                if (iVar2 != 0) {
                                  uVar5 = curl_multi_strerror(iVar2);
                                  curl_mfprintf(uVar1,
                                                "%s:%d curl_multi_setopt() failed, with code %d (%s)\n"
                                                ,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib582.c"
                                                ,0x128,iVar2,uVar5);
                                  curl._4_4_ = iVar2;
                                }
                                if (curl._4_4_ == 0) {
                                  iVar2 = curl_multi_setopt(sockets.write._8_8_,0x4e24,
                                                            curlTimerCallback);
                                  uVar1 = _stderr;
                                  if (iVar2 != 0) {
                                    uVar5 = curl_multi_strerror(iVar2);
                                    curl_mfprintf(uVar1,
                                                  "%s:%d curl_multi_setopt() failed, with code %d (%s)\n"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib582.c"
                                                  ,0x12a,iVar2,uVar5);
                                    curl._4_4_ = iVar2;
                                  }
                                  if (curl._4_4_ == 0) {
                                    iVar2 = curl_multi_setopt(sockets.write._8_8_,0x2715,auStack_100
                                                             );
                                    uVar1 = _stderr;
                                    if (iVar2 != 0) {
                                      uVar5 = curl_multi_strerror(iVar2);
                                      curl_mfprintf(uVar1,
                                                  "%s:%d curl_multi_setopt() failed, with code %d (%s)\n"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib582.c"
                                                  ,299,iVar2,uVar5);
                                      curl._4_4_ = iVar2;
                                    }
                                    if (curl._4_4_ == 0) {
                                      iVar2 = curl_multi_add_handle(sockets.write._8_8_,lVar6);
                                      uVar1 = _stderr;
                                      if (iVar2 != 0) {
                                        uVar5 = curl_multi_strerror(iVar2);
                                        curl_mfprintf(uVar1,
                                                  "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib582.c"
                                                  ,0x12d,iVar2,uVar5);
                                        curl._4_4_ = iVar2;
                                      }
                                      while (curl._4_4_ == 0) {
                                        iVar2 = checkForCompletion((CURLM *)sockets.write._8_8_,
                                                                   &local_104);
                                        if (iVar2 != 0) {
                                          if (local_104 == 0) {
                                            curl_mfprintf(_stderr,"Error uploading file.\n");
                                            curl._4_4_ = 0x7e;
                                          }
                                          break;
                                        }
                                        tv.tv_usec._4_4_ = 0;
                                        _auStack_268 = 10;
                                        tv.tv_sec = 0;
                                        for (__arr._4_4_ = 0; __arr._4_4_ < 0x10;
                                            __arr._4_4_ = __arr._4_4_ + 1) {
                                          writeSet.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
                                        }
                                        for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10;
                                            __arr_1._4_4_ = __arr_1._4_4_ + 1) {
                                          *(undefined8 *)(local_250 + (ulong)__arr_1._4_4_ * 8) = 0;
                                        }
                                        updateFdSet((Sockets *)&timeout.tv_usec,
                                                    (fd_set *)(writeSet.__fds_bits + 0xf),
                                                    (curl_socket_t *)((long)&tv.tv_usec + 4));
                                        updateFdSet((Sockets *)&sockets.read.count,
                                                    (fd_set *)local_250,
                                                    (curl_socket_t *)((long)&tv.tv_usec + 4));
                                        if (_auStack_100 == -1) {
                                          if (tv.tv_usec._4_4_ < 1) {
                                            _auStack_268 = 0;
                                            tv.tv_sec = 100000;
                                          }
                                        }
                                        else {
                                          iVar2 = getMicroSecondTimeout((timeval *)auStack_100);
                                          _auStack_268 = (long)(iVar2 / 1000000);
                                          tv.tv_sec = (__time_t)(iVar2 % 1000000);
                                        }
                                        iVar2 = select_wrapper(tv.tv_usec._4_4_,
                                                               (fd_set *)(writeSet.__fds_bits + 0xf)
                                                               ,(fd_set *)local_250,(fd_set *)0x0,
                                                               (timeval *)auStack_268);
                                        if (iVar2 == -1) {
                                          piVar3 = __errno_location();
                                          uVar1 = _stderr;
                                          iVar2 = *piVar3;
                                          pcVar4 = strerror(iVar2);
                                          curl_mfprintf(uVar1,
                                                  "%s:%d select() failed, with errno %d (%s)\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib582.c"
                                                  ,0x143,iVar2,pcVar4);
                                          curl._4_4_ = 0x79;
                                        }
                                        if (curl._4_4_ != 0) break;
                                        checkFdSet((CURLM *)sockets.write._8_8_,
                                                   (Sockets *)&timeout.tv_usec,
                                                   (fd_set *)(writeSet.__fds_bits + 0xf),1,"read");
                                        checkFdSet((CURLM *)sockets.write._8_8_,
                                                   (Sockets *)&sockets.read.count,
                                                   (fd_set *)local_250,2,"write");
                                        if ((_auStack_100 != -1) &&
                                           (iVar2 = getMicroSecondTimeout((timeval *)auStack_100),
                                           iVar2 == 0)) {
                                          notifyCurl((CURLM *)sockets.write._8_8_,-1,0,"timeout");
                                        }
                                        tVar8 = tutil_tvnow();
                                        older.tv_usec = tv_test_start.tv_usec;
                                        older.tv_sec = tv_test_start.tv_sec;
                                        lVar7 = tutil_tvdiff(tVar8,older);
                                        if (60000 < lVar7) {
                                          curl_mfprintf(_stderr,
                                                  "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib582.c"
                                                  ,0x14e);
                                          curl._4_4_ = 0x7d;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          curl_multi_remove_handle(sockets.write._8_8_,lVar6);
          curl_easy_cleanup(lVar6);
          curl_multi_cleanup(sockets.write._8_8_);
          curl_global_cleanup();
          fclose(__stream);
          free((void *)timeout.tv_usec);
          free((void *)sockets.read._8_8_);
          URL_local._4_4_ = curl._4_4_;
        }
        else {
          fclose(__stream);
          URL_local._4_4_ = curl._4_4_;
        }
      }
    }
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl = NULL;
  FILE *hd_src = NULL;
  int hd;
  int error;
  struct_stat file_info;
  CURLM *m = NULL;
  struct ReadWriteSockets sockets = {{NULL, 0, 0}, {NULL, 0, 0}};
  struct timeval timeout = {-1, 0};
  int success = 0;

  start_test_timing();

  if(!libtest_arg3) {
    fprintf(stderr, "Usage: lib582 [url] [filename] [username]\n");
    return TEST_ERR_USAGE;
  }

  hd_src = fopen(libtest_arg2, "rb");
  if(NULL == hd_src) {
    error = ERRNO;
    fprintf(stderr, "fopen() failed with error: %d (%s)\n",
            error, strerror(error));
    fprintf(stderr, "Error opening file: (%s)\n", libtest_arg2);
    return TEST_ERR_FOPEN;
  }

  /* get the file size of the local file */
  hd = fstat(fileno(hd_src), &file_info);
  if(hd == -1) {
    /* can't open file, bail out */
    error = ERRNO;
    fprintf(stderr, "fstat() failed with error: %d (%s)\n",
            error, strerror(error));
    fprintf(stderr, "ERROR: cannot open file (%s)\n", libtest_arg2);
    fclose(hd_src);
    return TEST_ERR_FSTAT;
  }
  fprintf(stderr, "Set to upload %d bytes\n", (int)file_info.st_size);

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    fclose(hd_src);
    return res;
  }

  easy_init(curl);

  /* enable uploading */
  easy_setopt(curl, CURLOPT_UPLOAD, 1L);

  /* specify target */
  easy_setopt(curl, CURLOPT_URL, URL);

  /* go verbose */
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* now specify which file to upload */
  easy_setopt(curl, CURLOPT_READDATA, hd_src);

  easy_setopt(curl, CURLOPT_USERPWD, libtest_arg3);
  easy_setopt(curl, CURLOPT_SSH_PUBLIC_KEYFILE, "curl_client_key.pub");
  easy_setopt(curl, CURLOPT_SSH_PRIVATE_KEYFILE, "curl_client_key");

  easy_setopt(curl, CURLOPT_INFILESIZE_LARGE, (curl_off_t)file_info.st_size);

  multi_init(m);

  multi_setopt(m, CURLMOPT_SOCKETFUNCTION, curlSocketCallback);
  multi_setopt(m, CURLMOPT_SOCKETDATA, &sockets);

  multi_setopt(m, CURLMOPT_TIMERFUNCTION, curlTimerCallback);
  multi_setopt(m, CURLMOPT_TIMERDATA, &timeout);

  multi_add_handle(m, curl);

  while(!checkForCompletion(m, &success)) {
    fd_set readSet, writeSet;
    curl_socket_t maxFd = 0;
    struct timeval tv = {10, 0};

    FD_ZERO(&readSet);
    FD_ZERO(&writeSet);
    updateFdSet(&sockets.read, &readSet, &maxFd);
    updateFdSet(&sockets.write, &writeSet, &maxFd);

    if(timeout.tv_sec != -1) {
      int usTimeout = getMicroSecondTimeout(&timeout);
      tv.tv_sec = usTimeout / 1000000;
      tv.tv_usec = usTimeout % 1000000;
    }
    else if(maxFd <= 0) {
      tv.tv_sec = 0;
      tv.tv_usec = 100000;
    }

    select_test(maxFd, &readSet, &writeSet, NULL, &tv);

    /* Check the sockets for reading / writing */
    checkFdSet(m, &sockets.read, &readSet, CURL_CSELECT_IN, "read");
    checkFdSet(m, &sockets.write, &writeSet, CURL_CSELECT_OUT, "write");

    if(timeout.tv_sec != -1 && getMicroSecondTimeout(&timeout) == 0) {
      /* Curl's timer has elapsed. */
      notifyCurl(m, CURL_SOCKET_TIMEOUT, 0, "timeout");
    }

    abort_on_test_timeout();
  }

  if(!success) {
    fprintf(stderr, "Error uploading file.\n");
    res = TEST_ERR_MAJOR_BAD;
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  curl_multi_remove_handle(m, curl);
  curl_easy_cleanup(curl);
  curl_multi_cleanup(m);
  curl_global_cleanup();

  /* close the local file */
  fclose(hd_src);

  /* free local memory */
  free(sockets.read.sockets);
  free(sockets.write.sockets);

  return res;
}